

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2.cpp
# Opt level: O3

uint32_t utrie2_get32_63(UTrie2 *trie,UChar32 c)

{
  ushort uVar1;
  uint uVar2;
  uint32_t uVar3;
  int iVar4;
  uint16_t *puVar5;
  ulong uVar6;
  
  if (trie->data16 != (uint16_t *)0x0) {
    puVar5 = trie->index;
    if ((uint)c < 0xd800) {
      uVar1 = puVar5[(uint)c >> 5];
    }
    else {
      if ((uint)c < 0x10000) {
        uVar6 = (ulong)(((uint)c >> 5) + 0x140);
        if (0xdbff < (uint)c) {
          uVar6 = (ulong)((uint)c >> 5);
        }
      }
      else {
        if (0x10ffff < (uint)c) {
          iVar4 = trie->indexLength + 0x80;
          goto LAB_002d779a;
        }
        if (trie->highStart <= c) {
          iVar4 = trie->highValueIndex;
          goto LAB_002d779a;
        }
        uVar6 = (ulong)(((uint)c >> 5 & 0x3f) + (uint)puVar5[(ulong)((uint)c >> 0xb) + 0x820]);
      }
      uVar1 = puVar5[uVar6];
    }
    iVar4 = (c & 0x1fU) + (uint)uVar1 * 4;
LAB_002d779a:
    return (uint32_t)puVar5[iVar4];
  }
  if (trie->data32 == (uint32_t *)0x0) {
    if (0x10ffff < (uint)c) {
      return trie->errorValue;
    }
    uVar3 = get32(trie->newTrie,c,'\x01');
    return uVar3;
  }
  if ((uint)c < 0xd800) {
    puVar5 = trie->index;
    uVar2 = (uint)c >> 5;
LAB_002d77dd:
    uVar1 = puVar5[uVar2];
  }
  else {
    if ((uint)c < 0x10000) {
      uVar2 = ((uint)c >> 5) + 0x140;
      if (0xdbff < (uint)c) {
        uVar2 = (uint)c >> 5;
      }
      puVar5 = trie->index;
      goto LAB_002d77dd;
    }
    iVar4 = 0x80;
    if (0x10ffff < (uint)c) goto LAB_002d77e7;
    if (trie->highStart <= c) {
      iVar4 = trie->highValueIndex;
      goto LAB_002d77e7;
    }
    uVar1 = trie->index[((uint)c >> 5 & 0x3f) + (uint)trie->index[(ulong)((uint)c >> 0xb) + 0x820]];
  }
  iVar4 = (c & 0x1fU) + (uint)uVar1 * 4;
LAB_002d77e7:
  return trie->data32[iVar4];
}

Assistant:

U_CAPI uint32_t U_EXPORT2
utrie2_get32(const UTrie2 *trie, UChar32 c) {
    if(trie->data16!=NULL) {
        return UTRIE2_GET16(trie, c);
    } else if(trie->data32!=NULL) {
        return UTRIE2_GET32(trie, c);
    } else if((uint32_t)c>0x10ffff) {
        return trie->errorValue;
    } else {
        return get32(trie->newTrie, c, TRUE);
    }
}